

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom(UninterpretedOption *this,Message *from)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if ((UninterpretedOption *)from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.cc"
               ,0x26f6);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((from->super_MessageLite)._vptr_MessageLite ==
      (_func_int **)&PTR__UninterpretedOption_003ba128) {
    MergeFrom(this,(UninterpretedOption *)from);
  }
  else {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.UninterpretedOption)
  GOOGLE_DCHECK_NE(&from, this);
  const UninterpretedOption* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<UninterpretedOption>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.UninterpretedOption)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.UninterpretedOption)
    MergeFrom(*source);
  }
}